

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.h
# Opt level: O0

void __thiscall L14_1::Student::~Student(Student *this)

{
  Student *this_local;
  
  std::valarray<double>::~valarray(&this->_scores);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Student() {}